

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonarray.cpp
# Opt level: O3

QDebug operator<<(QDebug dbg,QJsonArray *a)

{
  char *pcVar1;
  storage_type *in_RCX;
  storage_type *psVar2;
  undefined8 *in_RDX;
  char *pcVar3;
  QString *this;
  QCborContainerPrivate *pQVar4;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QByteArrayView ba_01;
  QByteArrayView ba_02;
  QDebugStateSaver saver;
  QByteArray local_58;
  QDebugStateSaver local_40;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_40.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&local_40,(QDebug *)a);
  if ((QCborContainerPrivate *)*in_RDX == (QCborContainerPrivate *)0x0) {
    pQVar4 = (a->a).d.ptr;
    ba_02.m_data = in_RCX;
    ba_02.m_size = (qsizetype)"QJsonArray()";
    QString::fromUtf8(&local_38,(QString *)0xc,ba_02);
    QTextStream::operator<<((QTextStream *)pQVar4,&local_38);
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar4 = (a->a).d.ptr;
    if (*(char *)&(pQVar4->elements).d.ptr == '\x01') {
      QTextStream::operator<<((QTextStream *)pQVar4,' ');
      pQVar4 = (a->a).d.ptr;
    }
    (a->a).d.ptr = (QCborContainerPrivate *)0x0;
    ((dbg.stream)->ts)._vptr_QTextStream = (_func_int **)pQVar4;
  }
  else {
    local_58.d.d = (Data *)0x0;
    local_58.d.ptr = (char *)0x0;
    local_58.d.size = 0;
    psVar2 = (storage_type *)0x1;
    QJsonPrivate::Writer::arrayToJson((QCborContainerPrivate *)*in_RDX,&local_58,0,true);
    pQVar4 = (a->a).d.ptr;
    *(undefined1 *)&(pQVar4->elements).d.ptr = 0;
    ba.m_data = psVar2;
    ba.m_size = (qsizetype)"QJsonArray(";
    QString::fromUtf8(&local_38,(QString *)0xb,ba);
    QTextStream::operator<<((QTextStream *)pQVar4,&local_38);
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar4 = (a->a).d.ptr;
    if (*(char *)&(pQVar4->elements).d.ptr == '\x01') {
      QTextStream::operator<<((QTextStream *)pQVar4,' ');
      pQVar4 = (a->a).d.ptr;
    }
    pcVar3 = local_58.d.ptr;
    if (local_58.d.ptr == (char *)0x0) {
      pcVar3 = &QByteArray::_empty;
    }
    this = (QString *)0xffffffffffffffff;
    do {
      pcVar1 = pcVar3 + 1 + (long)this;
      this = (QString *)((long)&(this->d).d + 1);
    } while (*pcVar1 != '\0');
    ba_00.m_data = psVar2;
    ba_00.m_size = (qsizetype)pcVar3;
    QString::fromUtf8(&local_38,this,ba_00);
    QTextStream::operator<<((QTextStream *)pQVar4,&local_38);
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar4 = (a->a).d.ptr;
    if (*(char *)&(pQVar4->elements).d.ptr == '\x01') {
      QTextStream::operator<<((QTextStream *)pQVar4,' ');
      pQVar4 = (a->a).d.ptr;
    }
    ba_01.m_data = psVar2;
    ba_01.m_size = (qsizetype)")";
    QString::fromUtf8(&local_38,(QString *)0x1,ba_01);
    QTextStream::operator<<((QTextStream *)pQVar4,&local_38);
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar4 = (a->a).d.ptr;
    if (*(char *)&(pQVar4->elements).d.ptr == '\x01') {
      QTextStream::operator<<((QTextStream *)pQVar4,' ');
      pQVar4 = (a->a).d.ptr;
    }
    (a->a).d.ptr = (QCborContainerPrivate *)0x0;
    ((dbg.stream)->ts)._vptr_QTextStream = (_func_int **)pQVar4;
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  QDebugStateSaver::~QDebugStateSaver(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QJsonArray &a)
{
    QDebugStateSaver saver(dbg);
    if (!a.a) {
        dbg << "QJsonArray()";
        return dbg;
    }
    QByteArray json;
    QJsonPrivate::Writer::arrayToJson(a.a.data(), json, 0, true);
    dbg.nospace() << "QJsonArray("
                  << json.constData() // print as utf-8 string without extra quotation marks
                  << ")";
    return dbg;
}